

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O3

void nn_aipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *in_RAX;
  nn_fsm *pnVar2;
  
  if (type == -3 && src == -2) {
LAB_0015f35b:
    nn_aipc_shutdown_cold_2();
    pnVar2 = in_RAX;
  }
  else {
    pnVar2 = self + 1;
    if (*(int *)&self[1].fn == 8) goto LAB_0015f38c;
    if (*(int *)&self[1].fn != 7) {
      nn_aipc_shutdown_cold_1();
      goto LAB_0015f35b;
    }
  }
  iVar1 = nn_sipc_isidle((nn_sipc *)&self[8].owner);
  if (iVar1 == 0) {
    return;
  }
  nn_usock_stop((nn_usock *)&self[1].state);
  *(undefined4 *)&pnVar2->fn = 8;
LAB_0015f38c:
  iVar1 = nn_usock_isidle((nn_usock *)&self[1].state);
  if (iVar1 == 0) {
    return;
  }
  if ((nn_usock *)self[8].shutdown_fn != (nn_usock *)0x0) {
    if (self[8].srcptr == (void *)0x0) {
      nn_aipc_shutdown_cold_3();
    }
    nn_usock_swap_owner((nn_usock *)self[8].shutdown_fn,(nn_fsm_owner *)&self[8].state);
    self[8].shutdown_fn = (nn_fsm_fn)0x0;
    self[8].state = -1;
    self[8].srcptr = (void *)0x0;
  }
  *(undefined4 *)&pnVar2->fn = 1;
  nn_fsm_stopped(self,0x85b9);
  return;
}

Assistant:

static void nn_aipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aipc *aipc;

    aipc = nn_cont (self, struct nn_aipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sipc_isidle (&aipc->sipc)) {
            nn_ep_stat_increment (aipc->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sipc_stop (&aipc->sipc);
        }
        aipc->state = NN_AIPC_STATE_STOPPING_SIPC_FINAL;
    }
    if (nn_slow (aipc->state == NN_AIPC_STATE_STOPPING_SIPC_FINAL)) {
        if (!nn_sipc_isidle (&aipc->sipc))
            return;
        nn_usock_stop (&aipc->usock);
        aipc->state = NN_AIPC_STATE_STOPPING;
    }
    if (nn_slow (aipc->state == NN_AIPC_STATE_STOPPING)) {
        if (!nn_usock_isidle (&aipc->usock))
            return;
       if (aipc->listener) {
            nn_assert (aipc->listener_owner.fsm);
            nn_usock_swap_owner (aipc->listener, &aipc->listener_owner);
            aipc->listener = NULL;
            aipc->listener_owner.src = -1;
            aipc->listener_owner.fsm = NULL;
        }
        aipc->state = NN_AIPC_STATE_IDLE;
        nn_fsm_stopped (&aipc->fsm, NN_AIPC_STOPPED);
        return;
    }

    nn_fsm_bad_state(aipc->state, src, type);
}